

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O1

xr_writer * __thiscall
xray_re::xr_file_system::w_open(xr_file_system *this,char *path,bool ignore_ro)

{
  char cVar1;
  bool bVar2;
  _Alloc_hider _Var3;
  FILE *pFVar4;
  xr_fake_writer *this_00;
  int *piVar5;
  undefined7 in_register_00000011;
  CPath p;
  CPath ds;
  path local_68;
  path local_40;
  
  local_40._M_pathname._M_dataplus._M_p = path;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_68,(char **)&local_40,auto_format);
  _Var3._M_p = local_68._M_pathname._M_dataplus._M_p;
  if (((int)CONCAT71(in_register_00000011,ignore_ro) == 0) && ((this->m_flags & 1) != 0)) {
    dbg("fs_ro: writing %s",path);
    this_00 = (xr_fake_writer *)operator_new(0x2068);
    xr_fake_writer::xr_fake_writer(this_00);
  }
  else {
    do {
      if (*_Var3._M_p == '\\') {
        *_Var3._M_p = '/';
      }
      cVar1 = *_Var3._M_p;
      _Var3._M_p = _Var3._M_p + 1;
    } while (cVar1 != '\0');
    pFVar4 = fopen(local_68._M_pathname._M_dataplus._M_p,"w");
    if (pFVar4 == (FILE *)0x0) {
      piVar5 = __errno_location();
      if (*piVar5 == 2) {
        std::filesystem::__cxx11::path::path(&local_40,&local_68);
        CPath::remove_filename_abi_cxx11_((CPath *)&local_40);
        bVar2 = CPath::create_directory_recursive((CPath *)&local_40);
        if (bVar2) {
          this_00 = (xr_fake_writer *)w_open(this,local_68._M_pathname._M_dataplus._M_p,ignore_ro);
        }
        else {
          this_00 = (xr_fake_writer *)0x0;
        }
        std::filesystem::__cxx11::path::~path(&local_40);
      }
      else {
        this_00 = (xr_fake_writer *)0x0;
      }
    }
    else {
      this_00 = (xr_fake_writer *)operator_new(0x2060);
      (this_00->super_xr_writer)._vptr_xr_writer = (_func_int **)&PTR__xr_writer_0024a320;
      (this_00->super_xr_writer).m_open_chunks.c.
      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      (this_00->super_xr_writer).m_open_chunks.c.
      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_map_size = 0;
      (this_00->super_xr_writer).m_open_chunks.c.
      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      *(_Elt_pointer *)
       ((long)&(this_00->super_xr_writer).m_open_chunks.c.
               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
      *(_Elt_pointer *)
       ((long)&(this_00->super_xr_writer).m_open_chunks.c.
               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
      *(_Map_pointer *)
       ((long)&(this_00->super_xr_writer).m_open_chunks.c.
               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
      (this_00->super_xr_writer).m_open_chunks.c.
      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      *(_Elt_pointer *)
       ((long)&(this_00->super_xr_writer).m_open_chunks.c.
               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
      *(_Elt_pointer *)
       ((long)&(this_00->super_xr_writer).m_open_chunks.c.
               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
      *(_Map_pointer *)
       ((long)&(this_00->super_xr_writer).m_open_chunks.c.
               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &(this_00->super_xr_writer).m_open_chunks,0);
      (this_00->super_xr_writer)._vptr_xr_writer = (_func_int **)&PTR__xr_file_writer_posix_0024a458
      ;
      this_00->m_pos = (size_t)pFVar4;
    }
  }
  std::filesystem::__cxx11::path::~path(&local_68);
  return &this_00->super_xr_writer;
}

Assistant:

xr_writer* xr_file_system::w_open(const char* path, bool ignore_ro) const
{
FILE* outfile;
CPath p(path);

	if (!ignore_ro && read_only()) {
		dbg("fs_ro: writing %s", path);
		return new xr_fake_writer();
	}

	p.make_preferred();
	outfile = fopen(p.c_str(), "w");
	if(outfile == nullptr)
	{
		if(errno == ENOENT)
		{
			auto ds{p};

			ds.remove_filename();
			if(!ds.create_directory_recursive())
				return nullptr;

			return w_open(p.c_str(), ignore_ro);
		}
		else
		{
			return nullptr;
		}
	}

	xr_writer* w = new xr_file_writer_posix(outfile);

	if(w == nullptr)
		fclose(outfile);

	return w;
}